

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::Generators::GeneratorUntypedBase::~GeneratorUntypedBase(GeneratorUntypedBase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_GeneratorUntypedBase = (_func_int **)&PTR___cxa_pure_virtual_003211a8;
  pcVar1 = (this->m_stringReprCache)._M_dataplus._M_p;
  paVar2 = &(this->m_stringReprCache).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

GeneratorUntypedBase::~GeneratorUntypedBase() = default;